

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O3

int32_t __thiscall
charls::jls_codec<charls::lossless_traits<charls::quad<unsigned_char>,_8>,_charls::encoder_strategy>
::do_run_mode(jls_codec<charls::lossless_traits<charls::quad<unsigned_char>,_8>,_charls::encoder_strategy>
              *this,int32_t index,encoder_strategy *param_2)

{
  pixel_type *ppVar1;
  pixel_type *ppVar2;
  quad<unsigned_char> qVar3;
  int iVar4;
  long lVar5;
  uint run_length;
  uint run_length_00;
  ulong uVar6;
  
  ppVar1 = this->current_line_;
  ppVar2 = this->previous_line_;
  run_length = this->width_ - index;
  qVar3 = ppVar1[(long)index + -1];
  lVar5 = 0;
  uVar6 = 0;
  do {
    if (((uint)ppVar1[(long)index + uVar6] & 0xffffff) != ((uint)qVar3 & 0xffffff)) {
      run_length_00 = (uint)uVar6;
      encode_run_pixels(this,run_length_00,run_length == run_length_00);
      if (run_length == run_length_00) {
        return run_length;
      }
      lVar5 = lVar5 >> 0x1e;
      qVar3 = encode_run_interruption_pixel
                        (this,*(quad<unsigned_char> *)
                               (&ppVar1[index].super_triplet<unsigned_char>.field_0 + lVar5),qVar3,
                         *(quad<unsigned_char> *)
                          (&ppVar2[index].super_triplet<unsigned_char>.field_0 + lVar5));
      *(quad<unsigned_char> *)(&ppVar1[index].super_triplet<unsigned_char>.field_0 + lVar5) = qVar3;
      iVar4 = 1;
      if (1 < this->run_index_) {
        iVar4 = this->run_index_;
      }
      this->run_index_ = iVar4 + -1;
      return run_length_00 + 1;
    }
    ppVar1[(long)index + uVar6] = qVar3;
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 0x100000000;
  } while (run_length != uVar6);
  encode_run_pixels(this,run_length,true);
  return run_length;
}

Assistant:

int32_t do_run_mode(const int32_t index, encoder_strategy* /*strategy*/)
    {
        const int32_t count_type_remain = width_ - index;
        pixel_type* type_cur_x{current_line_ + index};
        const pixel_type* type_prev_x{previous_line_ + index};

        const pixel_type ra{type_cur_x[-1]};

        int32_t run_length{};
        while (traits_.is_near(type_cur_x[run_length], ra))
        {
            type_cur_x[run_length] = ra;
            ++run_length;

            if (run_length == count_type_remain)
                break;
        }

        encode_run_pixels(run_length, run_length == count_type_remain);

        if (run_length == count_type_remain)
            return run_length;

        type_cur_x[run_length] = encode_run_interruption_pixel(type_cur_x[run_length], ra, type_prev_x[run_length]);
        decrement_run_index();
        return run_length + 1;
    }